

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.h
# Opt level: O2

void __thiscall
ApprovalTests::CartesianProduct::Detail::
find_if_body<ApprovalTests::CartesianProduct::Detail::is_range_empty>::operator()
          (find_if_body<ApprovalTests::CartesianProduct::Detail::is_range_empty> *this,
          vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *value)

{
  size_t sVar1;
  
  if (this->found == false) {
    sVar1 = this->currentIndex;
    if ((value->super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (value->super__Vector_base<StringMakerPrintable,_std::allocator<StringMakerPrintable>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      *this->index = sVar1;
      this->found = true;
    }
    this->currentIndex = sVar1 + 1;
  }
  return;
}

Assistant:

void operator()(T&& value)
                {
                    if (found)
                        return;
                    if (pred(std::forward<T>(value)))
                    {
                        index = currentIndex;
                        found = true;
                    }
                    ++currentIndex;
                }